

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::cr(Forth *this)

{
  char cVar1;
  
  if (this->writeToTarget == ToStdCout) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  else {
    if (this->writeToTarget != ToString) {
      return;
    }
    cVar1 = (char)this + ' ';
    std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x20 + -0x18) + cVar1);
    std::ostream::put(cVar1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void cr() {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << std::endl;
				break;
			case ToStdCout:
				std::cout << std::endl;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}